

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_faceid_range(REF_GRID ref_grid,REF_INT *min_faceid,REF_INT *max_faceid)

{
  REF_STATUS RVar1;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  REF_INT local_98 [2];
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_INT *max_faceid_local;
  REF_INT *min_faceid_local;
  REF_GRID ref_grid_local;
  
  *min_faceid = 0x7fffffff;
  *max_faceid = -0x80000000;
  unique0x00012000 = ref_grid->cell[3];
  for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffd8->max; nodes[0x19] = nodes[0x19] + 1) {
    RVar1 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],local_98);
    if (RVar1 == 0) {
      if (*min_faceid < nodes[(long)stack0xffffffffffffffd8->node_per + -2]) {
        local_9c = *min_faceid;
      }
      else {
        local_9c = nodes[(long)stack0xffffffffffffffd8->node_per + -2];
      }
      *min_faceid = local_9c;
      if (nodes[(long)stack0xffffffffffffffd8->node_per + -2] < *max_faceid) {
        local_a0 = *max_faceid;
      }
      else {
        local_a0 = nodes[(long)stack0xffffffffffffffd8->node_per + -2];
      }
      *max_faceid = local_a0;
    }
  }
  unique0x00012000 = ref_grid->cell[6];
  for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffd8->max; nodes[0x19] = nodes[0x19] + 1) {
    RVar1 = ref_cell_nodes(stack0xffffffffffffffd8,nodes[0x19],local_98);
    if (RVar1 == 0) {
      if (*min_faceid < nodes[(long)stack0xffffffffffffffd8->node_per + -2]) {
        local_a4 = *min_faceid;
      }
      else {
        local_a4 = nodes[(long)stack0xffffffffffffffd8->node_per + -2];
      }
      *min_faceid = local_a4;
      if (nodes[(long)stack0xffffffffffffffd8->node_per + -2] < *max_faceid) {
        local_a8 = *max_faceid;
      }
      else {
        local_a8 = nodes[(long)stack0xffffffffffffffd8->node_per + -2];
      }
      *max_faceid = local_a8;
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_export_faceid_range(REF_GRID ref_grid,
                                                  REF_INT *min_faceid,
                                                  REF_INT *max_faceid) {
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  *min_faceid = REF_INT_MAX;
  *max_faceid = REF_INT_MIN;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    *min_faceid = MIN(*min_faceid, nodes[ref_cell_id_index(ref_cell)]);
    *max_faceid = MAX(*max_faceid, nodes[ref_cell_id_index(ref_cell)]);
  }